

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_echo.c
# Opt level: O0

void handle_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                 cio_error err,size_t bytes_transferred)

{
  _Bool _Var1;
  int iVar2;
  size_t new_length;
  void *new_data;
  cio_write_buffer *write_buffer;
  cio_write_buffer *write_buffer_1;
  cio_buffered_stream *buffered_stream;
  size_t bytes_transferred_local;
  cio_error err_local;
  cio_write_buffer *buffer_local;
  void *handler_context_local;
  cio_io_stream *io_stream_local;
  
  if (err == CIO_SUCCESS) {
    new_data = cio_write_buffer_queue_dequeue((cio_write_buffer *)((long)handler_context + 0x50));
    buffered_stream = (cio_buffered_stream *)bytes_transferred;
    while (new_data != (void *)0x0) {
      _Var1 = buffer_partially_written((cio_write_buffer *)new_data,(size_t)buffered_stream);
      if (_Var1) {
        _Var1 = buffer_is_temp_buffer
                          ((cio_buffered_stream *)handler_context,(cio_write_buffer *)new_data);
        if (!_Var1) {
          cio_write_buffer_queue_tail
                    (*(cio_write_buffer **)((long)handler_context + 0x48),
                     (cio_write_buffer *)new_data);
        }
        cio_write_buffer_const_element_init
                  ((cio_write_buffer *)((long)handler_context + 0x70),
                   (void *)((long)&buffered_stream->stream + *(long *)((long)new_data + 0x10)),
                   *(long *)((long)new_data + 0x18) - (long)buffered_stream);
        cio_write_buffer_queue_head
                  ((cio_write_buffer *)((long)handler_context + 0x50),
                   (cio_write_buffer *)((long)handler_context + 0x70));
        break;
      }
      buffered_stream =
           (cio_buffered_stream *)((long)buffered_stream - *(long *)((long)new_data + 0x18));
      _Var1 = buffer_is_temp_buffer
                        ((cio_buffered_stream *)handler_context,(cio_write_buffer *)new_data);
      if (!_Var1) {
        cio_write_buffer_queue_tail
                  (*(cio_write_buffer **)((long)handler_context + 0x48),(cio_write_buffer *)new_data
                  );
      }
      new_data = cio_write_buffer_queue_dequeue((cio_write_buffer *)((long)handler_context + 0x50));
    }
    _Var1 = cio_write_buffer_queue_empty((cio_write_buffer *)((long)handler_context + 0x50));
    if (_Var1) {
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),0);
    }
    else {
      iVar2 = (**(code **)(*handler_context + 8))
                        (io_stream,(long)handler_context + 0x50,handle_write,handler_context);
      if (iVar2 != 0) {
        (**(code **)((long)handler_context + 0x38))
                  (handler_context,*(undefined8 *)((long)handler_context + 0x40),iVar2);
      }
    }
  }
  else {
    write_buffer = cio_write_buffer_queue_dequeue
                             ((cio_write_buffer *)((long)handler_context + 0x50));
    while (write_buffer != (cio_write_buffer *)0x0) {
      _Var1 = buffer_is_temp_buffer((cio_buffered_stream *)handler_context,write_buffer);
      if (!_Var1) {
        cio_write_buffer_queue_tail
                  (*(cio_write_buffer **)((long)handler_context + 0x48),write_buffer);
      }
      write_buffer = cio_write_buffer_queue_dequeue
                               ((cio_write_buffer *)((long)handler_context + 0x50));
    }
    (**(code **)((long)handler_context + 0x38))
              (handler_context,*(undefined8 *)((long)handler_context + 0x40),err);
  }
  return;
}

Assistant:

static void handle_write(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err)
{
	(void)buffered_stream;
	struct echo_client *client = handler_context;

	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "write error!\n");
		return;
	}

	cio_read_buffer_consume(&client->rb, client->number_of_bytes_read);
	struct cio_io_stream *stream = cio_socket_get_io_stream(&client->socket);
	stream->read_some(stream, &client->rb, handle_read, client);
}